

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswClass.c
# Opt level: O1

void Ssw_ClassesStop(Ssw_Cla_t *p)

{
  Vec_Ptr_t *pVVar1;
  
  pVVar1 = p->vClassNew;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vClassOld;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      pVVar1->pArray = (void **)0x0;
    }
    free(pVVar1);
  }
  pVVar1 = p->vRefined;
  if (pVVar1->pArray != (void **)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (void **)0x0;
  }
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    free(pVVar1);
  }
  if (p->pId2Class != (Aig_Obj_t ***)0x0) {
    free(p->pId2Class);
    p->pId2Class = (Aig_Obj_t ***)0x0;
  }
  if (p->pClassSizes != (int *)0x0) {
    free(p->pClassSizes);
    p->pClassSizes = (int *)0x0;
  }
  if (p->pMemClasses != (Aig_Obj_t **)0x0) {
    free(p->pMemClasses);
    p->pMemClasses = (Aig_Obj_t **)0x0;
  }
  if (p != (Ssw_Cla_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Ssw_ClassesStop( Ssw_Cla_t * p )
{
    if ( p->vClassNew )    Vec_PtrFree( p->vClassNew );
    if ( p->vClassOld )    Vec_PtrFree( p->vClassOld );
    Vec_PtrFree( p->vRefined );
    ABC_FREE( p->pId2Class );
    ABC_FREE( p->pClassSizes );
    ABC_FREE( p->pMemClasses );
    ABC_FREE( p );
}